

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vmsumuhm_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  ushort uVar10;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint32_t prod [8];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  lVar3 = 0;
  do {
    uVar1 = *(ulong *)((long)a + lVar3 * 2);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar1;
    uVar2 = *(ulong *)((long)b + lVar3 * 2);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar2;
    auVar5 = pmulhuw(auVar6,auVar5);
    auVar7._0_2_ = (short)uVar2 * (short)uVar1;
    uVar10 = (short)(uVar2 >> 0x30) * (short)(uVar1 >> 0x30);
    auVar9._0_12_ = ZEXT212(uVar10) << 0x30;
    auVar9._12_2_ = uVar10;
    auVar9._14_2_ = auVar5._6_2_;
    auVar8._12_4_ = auVar9._12_4_;
    auVar8._0_10_ = (unkuint10)uVar10 << 0x30;
    auVar8._10_2_ = auVar5._4_2_;
    auVar7._8_8_ = (undefined8)
                   (CONCAT64(auVar8._10_6_,
                             CONCAT22((short)(uVar2 >> 0x20) * (short)(uVar1 >> 0x20),uVar10)) >>
                   0x10);
    auVar7._6_2_ = auVar5._2_2_;
    auVar7._4_2_ = (short)(uVar2 >> 0x10) * (short)(uVar1 >> 0x10);
    auVar7._2_2_ = auVar5._0_2_;
    *(undefined1 (*) [16])(prod + lVar3) = auVar7;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  lVar3 = 3;
  do {
    r->u32[lVar3] = prod[lVar3 * 2] + c->u32[lVar3] + prod[lVar3 * 2 + 1];
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar4);
  return;
}

Assistant:

void helper_vmsumuhm(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    uint32_t prod[8];
    int i;

    for (i = 0; i < ARRAY_SIZE(r->u16); i++) {
        prod[i] = a->u16[i] * b->u16[i];
    }

    VECTOR_FOR_INORDER_I(i, u32) {
        r->u32[i] = c->u32[i] + prod[2 * i] + prod[2 * i + 1];
    }
}